

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImGuiMetricsConfig *p_open_00;
  bool *pbVar1;
  ImVector<ImGuiPopupData> *this;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  ImGuiViewportP *pIVar4;
  ImFontAtlas *atlas;
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  ImGuiContext *g;
  ImGuiTable *pIVar9;
  ImDrawList *pIVar10;
  ImGuiWindow **ppIVar11;
  ImGuiViewportP **ppIVar12;
  ImDrawList **ppIVar13;
  ImGuiPopupData *pIVar14;
  ImGuiTabBar *tab_bar;
  ImGuiSettingsHandler *pIVar15;
  ImGuiWindowSettings *settings;
  ImGuiTableSettings *settings_00;
  ImU32 col;
  long lVar16;
  char *pcVar17;
  char *pcVar18;
  int rect_n;
  int i;
  int iVar19;
  uint uVar20;
  int iVar21;
  undefined **ppuVar22;
  char **ppcVar23;
  int layer_i;
  ImVector<ImGuiWindow_*> *windows;
  int n_6;
  ImVector<ImDrawList_*> *this_00;
  int column_n;
  ulong uVar24;
  ImVector<ImGuiViewportP_*> *pIVar25;
  int rect_n_1;
  ulong uVar26;
  byte bVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  float fVar31;
  float fVar32;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined1 auVar35 [16];
  ImRect IVar36;
  ImVec2 local_1d8;
  ImVector<ImGuiViewportP_*> *local_1d0;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  int *local_1b0;
  undefined1 local_1a8 [16];
  int *local_198;
  ImVec2 local_190;
  undefined8 local_188;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  char buf_1 [128];
  char *wrt_rects_names [8];
  char *trt_rects_names [13];
  
  pIVar6 = GImGui;
  bVar27 = 0;
  p_open_00 = &GImGui->DebugMetricsConfig;
  if ((GImGui->DebugMetricsConfig).ShowDebugLog == true) {
    ShowDebugLogWindow(&p_open_00->ShowDebugLog);
  }
  pbVar1 = &(pIVar6->DebugMetricsConfig).ShowStackTool;
  if ((pIVar6->DebugMetricsConfig).ShowStackTool == true) {
    ShowStackToolWindow(pbVar1);
  }
  bVar8 = Begin("Dear ImGui Metrics/Debugger",p_open,0);
  if ((bVar8) &&
     (pIVar3 = GImGui->CurrentWindow, pIVar3->WriteAccessed = true, pIVar3->BeginCount < 2)) {
    Text("Dear ImGui %s","1.88");
    fVar31 = (pIVar6->IO).Framerate;
    Text("Application average %.3f ms/frame (%.1f FPS)",SUB84((double)(1000.0 / fVar31),0),
         SUB84((double)fVar31,0));
    uVar20 = (pIVar6->IO).MetricsRenderIndices;
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar6->IO).MetricsRenderVertices,
         (ulong)uVar20,(long)(int)uVar20 / 3 & 0xffffffff);
    Text("%d visible windows, %d active allocations",(ulong)(uint)(pIVar6->IO).MetricsRenderWindows,
         (ulong)(uint)(pIVar6->IO).MetricsActiveAllocations);
    Separator();
    wrt_rects_names[6] = "ContentIdeal";
    wrt_rects_names[7] = "ContentRegionRect";
    wrt_rects_names[4] = "WorkRect";
    wrt_rects_names[5] = "Content";
    wrt_rects_names[2] = "InnerRect";
    wrt_rects_names[3] = "InnerClipRect";
    wrt_rects_names[0] = "OuterRect";
    wrt_rects_names[1] = "OuterRectClipped";
    ppuVar22 = &PTR_anon_var_dwarf_b6e2f_001d93a0;
    ppcVar23 = trt_rects_names;
    for (lVar16 = 0xd; lVar16 != 0; lVar16 = lVar16 + -1) {
      *ppcVar23 = *ppuVar22;
      ppuVar22 = ppuVar22 + (ulong)bVar27 * -2 + 1;
      ppcVar23 = ppcVar23 + (ulong)bVar27 * -2 + 1;
    }
    local_198 = &(pIVar6->DebugMetricsConfig).ShowWindowsRectsType;
    if ((pIVar6->DebugMetricsConfig).ShowWindowsRectsType < 0) {
      *local_198 = 4;
    }
    local_1b0 = &(pIVar6->DebugMetricsConfig).ShowTablesRectsType;
    if ((pIVar6->DebugMetricsConfig).ShowTablesRectsType < 0) {
      *local_1b0 = 2;
    }
    bVar8 = TreeNode("Tools");
    if (bVar8) {
      bVar8 = TreeNode("UTF-8 Encoding viewer");
      SameLine(0.0,-1.0);
      MetricsHelpMarker(
                       "You can also call ImGui::DebugTextEncoding() from your code with a given string to test that your UTF-8 encoding settings are correct."
                       );
      pIVar7 = GImGui;
      if (bVar8) {
        (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
        (pIVar7->NextItemData).Width = -1.1754944e-38;
        InputText("##Text",ShowMetricsWindow::buf,100,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        if (ShowMetricsWindow::buf[0] != '\0') {
          DebugTextEncoding(ShowMetricsWindow::buf);
        }
        TreePop();
      }
      bVar8 = Checkbox("Show Item Picker",&pIVar6->DebugItemPickerActive);
      if ((bVar8) && (pIVar6->DebugItemPickerActive == true)) {
        GImGui->DebugItemPickerActive = true;
      }
      SameLine(0.0,-1.0);
      MetricsHelpMarker(
                       "Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                       );
      Checkbox("Show Debug Log",&p_open_00->ShowDebugLog);
      SameLine(0.0,-1.0);
      MetricsHelpMarker("You can also call ImGui::ShowDebugLogWindow() from your code.");
      Checkbox("Show Stack Tool",pbVar1);
      SameLine(0.0,-1.0);
      MetricsHelpMarker("You can also call ImGui::ShowStackToolWindow() from your code.");
      Checkbox("Show windows begin order",&(pIVar6->DebugMetricsConfig).ShowWindowsBeginOrder);
      Checkbox("Show windows rectangles",&(pIVar6->DebugMetricsConfig).ShowWindowsRects);
      SameLine(0.0,-1.0);
      pIVar7 = GImGui;
      fVar31 = GImGui->FontSize;
      (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
      (pIVar7->NextItemData).Width = fVar31 * 12.0;
      bVar8 = Combo("##show_windows_rect_type",local_198,wrt_rects_names,8,8);
      pbVar1 = &(pIVar6->DebugMetricsConfig).ShowWindowsRects;
      *pbVar1 = (bool)(*pbVar1 | bVar8);
      if ((*pbVar1 != false) && (pIVar6->NavWindow != (ImGuiWindow *)0x0)) {
        BulletText("\'%s\':",pIVar6->NavWindow->Name);
        Indent(0.0);
        for (lVar16 = 0; lVar16 != 8; lVar16 = lVar16 + 1) {
          IVar36 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar6->NavWindow,(int)lVar16);
          Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",SUB84((double)IVar36.Min.x,0),
               SUB84((double)IVar36.Min.y,0),(double)IVar36.Max.x,SUB84((double)IVar36.Max.y,0),
               SUB84((double)(IVar36.Max.x - IVar36.Min.x),0),(double)(IVar36.Max.y - IVar36.Min.y),
               wrt_rects_names[lVar16]);
        }
        Unindent(0.0);
      }
      Checkbox("Show tables rectangles",&(pIVar6->DebugMetricsConfig).ShowTablesRects);
      uVar33 = 0;
      uVar34 = 0;
      SameLine(0.0,-1.0);
      pIVar7 = GImGui;
      fVar31 = GImGui->FontSize;
      (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
      (pIVar7->NextItemData).Width = fVar31 * 12.0;
      bVar8 = Combo("##show_table_rects_type",local_1b0,trt_rects_names,0xd,0xd);
      pbVar1 = &(pIVar6->DebugMetricsConfig).ShowTablesRects;
      *pbVar1 = (bool)(*pbVar1 | bVar8);
      if ((*pbVar1 != false) && (pIVar6->NavWindow != (ImGuiWindow *)0x0)) {
        local_188 = &pIVar6->Tables;
        iVar21 = 0;
        while (iVar21 < (pIVar6->Tables).Map.Data.Size) {
          local_1d0 = (ImVector<ImGuiViewportP_*> *)CONCAT44(local_1d0._4_4_,iVar21);
          pIVar9 = ImPool<ImGuiTable>::TryGetMapData(local_188,iVar21);
          if ((pIVar9 != (ImGuiTable *)0x0) && (pIVar6->FrameCount + -1 <= pIVar9->LastFrameActive))
          {
            if ((pIVar9->OuterWindow == pIVar6->NavWindow) ||
               (pIVar9->InnerWindow == pIVar6->NavWindow)) {
              BulletText("Table 0x%08X (%d columns, in \'%s\')",(ulong)pIVar9->ID,
                         (ulong)(uint)pIVar9->ColumnsCount,pIVar9->OuterWindow->Name);
              bVar8 = IsItemHovered(0);
              if (bVar8) {
                pIVar10 = GetForegroundDrawList();
                auVar5 = buf_1._0_16_;
                IVar2 = (pIVar9->OuterRect).Min;
                buf_1._4_4_ = IVar2.y + -1.0;
                buf_1._0_4_ = IVar2.x + -1.0;
                buf_1._8_8_ = auVar5._8_8_;
                IVar2 = (pIVar9->OuterRect).Max;
                local_1d8.y = IVar2.y + 1.0;
                local_1d8.x = IVar2.x + 1.0;
                uVar33 = 0;
                uVar34 = 0;
                ImDrawList::AddRect(pIVar10,(ImVec2 *)buf_1,&local_1d8,0xff00ffff,0.0,0,2.0);
              }
              Indent(0.0);
              for (uVar26 = 0; uVar26 != 0xd; uVar26 = uVar26 + 1) {
                iVar21 = (int)uVar26;
                if (uVar26 < 6) {
                  IVar36 = ShowMetricsWindow::Funcs::GetTableRect(pIVar9,iVar21,-1);
                  fStack_1c0 = (float)uVar33;
                  local_1c8._0_4_ = IVar36.Max.x;
                  local_1c8._4_4_ = IVar36.Max.y;
                  fStack_1bc = (float)uVar34;
                  local_1a8._8_4_ = extraout_XMM0_Dc_00;
                  local_1a8._0_4_ = IVar36.Min.x;
                  local_1a8._4_4_ = IVar36.Min.y;
                  local_1a8._12_4_ = extraout_XMM0_Dd_00;
                  ImFormatString(buf_1,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",
                                 SUB84((double)IVar36.Min.x,0),SUB84((double)IVar36.Min.y,0),
                                 (double)IVar36.Max.x,SUB84((double)IVar36.Max.y,0),
                                 SUB84((double)(IVar36.Max.x - IVar36.Min.x),0),
                                 (double)(IVar36.Max.y - IVar36.Min.y),trt_rects_names[uVar26]);
                  local_1d8.x = 0.0;
                  local_1d8.y = 0.0;
                  Selectable(buf_1,false,0,&local_1d8);
                  bVar8 = IsItemHovered(0);
                  if (bVar8) {
                    pIVar10 = GetForegroundDrawList();
                    local_1d8.y = (float)local_1a8._4_4_ + -1.0;
                    local_1d8.x = (float)local_1a8._0_4_ + -1.0;
                    local_190.y = (float)local_1c8._4_4_ + 1.0;
                    local_190.x = (float)local_1c8._0_4_ + 1.0;
                    uVar33 = 0;
                    uVar34 = 0;
                    ImDrawList::AddRect(pIVar10,&local_1d8,&local_190,0xff00ffff,0.0,0,2.0);
                  }
                }
                else if ((iVar21 == 8) || (iVar21 == 6)) {
                  uVar24 = 0;
                  while (iVar19 = (int)uVar24, iVar19 < pIVar9->ColumnsCount) {
                    IVar36 = ShowMetricsWindow::Funcs::GetTableRect(pIVar9,iVar21,iVar19);
                    fStack_1c0 = (float)uVar33;
                    local_1c8._0_4_ = IVar36.Max.x;
                    local_1c8._4_4_ = IVar36.Max.y;
                    fStack_1bc = (float)uVar34;
                    local_1a8._8_4_ = extraout_XMM0_Dc;
                    local_1a8._0_4_ = IVar36.Min.x;
                    local_1a8._4_4_ = IVar36.Min.y;
                    local_1a8._12_4_ = extraout_XMM0_Dd;
                    ImFormatString(buf_1,0x80,
                                   "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s",
                                   SUB84((double)IVar36.Min.x,0),SUB84((double)IVar36.Min.y,0),
                                   (double)IVar36.Max.x,SUB84((double)IVar36.Max.y,0),
                                   SUB84((double)(IVar36.Max.x - IVar36.Min.x),0),
                                   (double)(IVar36.Max.y - IVar36.Min.y),uVar24);
                    local_1d8.x = 0.0;
                    local_1d8.y = 0.0;
                    Selectable(buf_1,false,0,&local_1d8);
                    bVar8 = IsItemHovered(0);
                    if (bVar8) {
                      pIVar10 = GetForegroundDrawList();
                      local_1d8.y = (float)local_1a8._4_4_ + -1.0;
                      local_1d8.x = (float)local_1a8._0_4_ + -1.0;
                      local_190.y = (float)local_1c8._4_4_ + 1.0;
                      local_190.x = (float)local_1c8._0_4_ + 1.0;
                      uVar33 = 0;
                      uVar34 = 0;
                      ImDrawList::AddRect(pIVar10,&local_1d8,&local_190,0xff00ffff,0.0,0,2.0);
                    }
                    uVar24 = (ulong)(iVar19 + 1);
                  }
                }
              }
              Unindent(0.0);
            }
          }
          iVar21 = (int)local_1d0 + 1;
        }
      }
      TreePop();
    }
    windows = &pIVar6->Windows;
    iVar21 = 0;
    bVar8 = TreeNode("Windows","Windows (%d)",(ulong)(uint)(pIVar6->Windows).Size);
    if (bVar8) {
      DebugNodeWindowsList(windows,"By display order");
      DebugNodeWindowsList(&pIVar6->WindowsFocusOrder,"By focus order (root windows)");
      bVar8 = TreeNode("By submission order (begin stack)");
      if (bVar8) {
        ImVector<ImGuiWindow_*>::resize(&pIVar6->WindowsTempSortBuffer,0);
        for (iVar19 = 0; iVar19 < windows->Size; iVar19 = iVar19 + 1) {
          ppIVar11 = ImVector<ImGuiWindow_*>::operator[](windows,iVar19);
          if (pIVar6->FrameCount <= (*ppIVar11)->LastFrameActive + 1) {
            ppIVar11 = ImVector<ImGuiWindow_*>::operator[](windows,iVar19);
            ImVector<ImGuiWindow_*>::push_back(&pIVar6->WindowsTempSortBuffer,ppIVar11);
          }
        }
        ImQsort((pIVar6->WindowsTempSortBuffer).Data,(long)(pIVar6->WindowsTempSortBuffer).Size,8,
                ShowMetricsWindow::Func::WindowComparerByBeginOrder);
        DebugNodeWindowsListByBeginStackParent
                  ((pIVar6->WindowsTempSortBuffer).Data,(pIVar6->WindowsTempSortBuffer).Size,
                   (ImGuiWindow *)0x0);
        TreePop();
      }
      TreePop();
    }
    pIVar25 = &pIVar6->Viewports;
    uVar20 = 0;
    for (; iVar21 < pIVar25->Size; iVar21 = iVar21 + 1) {
      ppIVar12 = ImVector<ImGuiViewportP_*>::operator[](pIVar25,iVar21);
      uVar20 = uVar20 + ((*ppIVar12)->DrawDataBuilder).Layers[1].Size +
               ((*ppIVar12)->DrawDataBuilder).Layers[0].Size;
    }
    iVar21 = 0;
    bVar8 = TreeNode("DrawLists","DrawLists (%d)",(ulong)uVar20);
    local_1a8._0_8_ = windows;
    local_1d0 = pIVar25;
    if (bVar8) {
      Checkbox("Show ImDrawCmd mesh when hovering",&(pIVar6->DebugMetricsConfig).ShowDrawCmdMesh);
      Checkbox("Show ImDrawCmd bounding boxes when hovering",
               &(pIVar6->DebugMetricsConfig).ShowDrawCmdBoundingBoxes);
      for (; pIVar25 = local_1d0, iVar21 < local_1d0->Size; iVar21 = iVar21 + 1) {
        ppIVar12 = ImVector<ImGuiViewportP_*>::operator[](local_1d0,iVar21);
        pIVar4 = *ppIVar12;
        for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
          this_00 = (pIVar4->DrawDataBuilder).Layers + lVar16;
          for (iVar19 = 0; iVar19 < this_00->Size; iVar19 = iVar19 + 1) {
            ppIVar13 = ImVector<ImDrawList_*>::operator[](this_00,iVar19);
            DebugNodeDrawList((ImGuiWindow *)0x0,*ppIVar13,"DrawList");
          }
        }
        windows = (ImVector<ImGuiWindow_*> *)local_1a8._0_8_;
      }
      TreePop();
    }
    iVar21 = 0;
    bVar8 = TreeNode("Viewports","Viewports (%d)",(ulong)(uint)pIVar25->Size);
    if (bVar8) {
      fVar31 = GetTreeNodeToLabelSpacing();
      Indent(fVar31);
      pIVar3 = GImGui->CurrentWindow;
      pIVar25 = &GImGui->Viewports;
      _local_1c8 = _DAT_00196aa0;
      for (; iVar19 = pIVar25->Size, iVar21 < iVar19; iVar21 = iVar21 + 1) {
        ppIVar12 = ImVector<ImGuiViewportP_*>::operator[](pIVar25,iVar21);
        IVar36 = ImGuiViewportP::GetMainRect(*ppIVar12);
        uVar29 = -(uint)(IVar36.Min.y < fStack_1c0);
        uVar30 = -(uint)(IVar36.Min.x < fStack_1bc);
        uVar20 = -(uint)((float)local_1c8._0_4_ < IVar36.Max.y);
        uVar28 = -(uint)((float)local_1c8._4_4_ < IVar36.Max.x);
        auVar35._0_4_ = ~uVar20 & local_1c8._0_4_;
        auVar35._4_4_ = ~uVar28 & local_1c8._4_4_;
        auVar35._8_4_ = ~uVar29 & (uint)fStack_1c0;
        auVar35._12_4_ = ~uVar30 & (uint)fStack_1bc;
        auVar5._4_4_ = (uint)IVar36.Max.x & uVar28;
        auVar5._0_4_ = (uint)IVar36.Max.y & uVar20;
        auVar5._8_4_ = (uint)IVar36.Min.y & uVar29;
        auVar5._12_4_ = (uint)IVar36.Min.x & uVar30;
        _local_1c8 = auVar35 | auVar5;
      }
      IVar2 = (pIVar3->DC).CursorPos;
      fVar31 = local_1c8._8_4_;
      fVar32 = local_1c8._12_4_;
      local_178._8_4_ = fVar31;
      local_178._0_8_ = local_1c8._8_8_;
      local_178._12_4_ = fVar32;
      local_168 = 0.125;
      fStack_164 = 0.125;
      uStack_160 = 0;
      uStack_15c = 0;
      fStack_180 = 0.0 - fVar31 * 0.0;
      fStack_17c = 0.0 - fVar32 * 0.0;
      local_188 = (ImPool<ImGuiTable> *)CONCAT44(IVar2.y - fVar31 * 0.125,IVar2.x - fVar32 * 0.125);
      for (iVar21 = 0; auVar5 = buf_1._0_16_, iVar21 < iVar19; iVar21 = iVar21 + 1) {
        ppIVar12 = ImVector<ImGuiViewportP_*>::operator[](pIVar25,iVar21);
        pIVar4 = *ppIVar12;
        IVar2 = (pIVar4->super_ImGuiViewport).Pos;
        fVar31 = IVar2.x;
        fVar32 = IVar2.y;
        IVar2 = (pIVar4->super_ImGuiViewport).Size;
        buf_1._4_4_ = fVar32 * 0.125 + local_188._4_4_;
        buf_1._0_4_ = fVar31 * 0.125 + (float)local_188;
        buf_1._8_4_ = (IVar2.x + fVar31) * 0.125 + (float)local_188;
        buf_1._12_4_ = (IVar2.y + fVar32) * 0.125 + local_188._4_4_;
        DebugRenderViewportThumbnail(pIVar3->DrawList,pIVar4,(ImRect *)buf_1);
        iVar19 = pIVar25->Size;
      }
      buf_1._4_4_ = ((float)local_1c8._0_4_ - (float)local_178._0_4_) * fStack_164;
      buf_1._0_4_ = ((float)local_1c8._4_4_ - (float)local_178._4_4_) * local_168;
      buf_1._8_8_ = auVar5._8_8_;
      Dummy((ImVec2 *)buf_1);
      fVar31 = GetTreeNodeToLabelSpacing();
      Unindent(fVar31);
      pIVar25 = local_1d0;
      for (iVar21 = 0; iVar21 < pIVar25->Size; iVar21 = iVar21 + 1) {
        ppIVar12 = ImVector<ImGuiViewportP_*>::operator[](pIVar25,iVar21);
        DebugNodeViewport(*ppIVar12);
      }
      TreePop();
    }
    bVar8 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar6->OpenPopupStack).Size);
    if (bVar8) {
      this = &pIVar6->OpenPopupStack;
      for (iVar21 = 0; iVar21 < this->Size; iVar21 = iVar21 + 1) {
        pIVar14 = ImVector<ImGuiPopupData>::operator[](this,iVar21);
        pIVar3 = pIVar14->Window;
        pIVar14 = ImVector<ImGuiPopupData>::operator[](this,iVar21);
        pcVar17 = "";
        pcVar18 = "NULL";
        if (pIVar3 != (ImGuiWindow *)0x0) {
          pcVar18 = pIVar3->Name;
          pcVar17 = " ChildWindow";
          if (((uint)pIVar3->Flags >> 0x18 & 1) == 0) {
            pcVar17 = "";
          }
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)pIVar14->PopupId,pcVar18,pcVar17);
      }
      TreePop();
      windows = (ImVector<ImGuiWindow_*> *)local_1a8._0_8_;
    }
    iVar21 = 0;
    bVar8 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar6->TabBars).AliveCount);
    if (bVar8) {
      for (; iVar21 < (pIVar6->TabBars).Map.Data.Size; iVar21 = iVar21 + 1) {
        tab_bar = ImPool<ImGuiTabBar>::TryGetMapData(&pIVar6->TabBars,iVar21);
        if (tab_bar != (ImGuiTabBar *)0x0) {
          PushID(tab_bar);
          DebugNodeTabBar(tab_bar,"TabBar");
          PopID();
        }
      }
      TreePop();
      windows = (ImVector<ImGuiWindow_*> *)local_1a8._0_8_;
    }
    local_1c8 = (undefined1  [8])&pIVar6->Tables;
    iVar21 = 0;
    bVar8 = TreeNode("Tables","Tables (%d)",(ulong)(uint)(pIVar6->Tables).AliveCount);
    if (bVar8) {
      for (; iVar21 < (pIVar6->Tables).Map.Data.Size; iVar21 = iVar21 + 1) {
        pIVar9 = ImPool<ImGuiTable>::TryGetMapData((ImPool<ImGuiTable> *)local_1c8,iVar21);
        if (pIVar9 != (ImGuiTable *)0x0) {
          DebugNodeTable(pIVar9);
        }
      }
      TreePop();
    }
    atlas = (pIVar6->IO).Fonts;
    bVar8 = TreeNode("Fonts","Fonts (%d)",(ulong)(uint)(atlas->Fonts).Size);
    if (bVar8) {
      ShowFontAtlas(atlas);
      TreePop();
    }
    bVar8 = TreeNode("InputText");
    if (bVar8) {
      DebugNodeInputTextState(&pIVar6->InputTextState);
      TreePop();
    }
    bVar8 = TreeNode("Settings");
    if (bVar8) {
      bVar8 = SmallButton("Clear");
      if (bVar8) {
        ClearIniSettings();
      }
      SameLine(0.0,-1.0);
      bVar8 = SmallButton("Save to memory");
      if (bVar8) {
        SaveIniSettingsToMemory((size_t *)0x0);
      }
      SameLine(0.0,-1.0);
      bVar8 = SmallButton("Save to disk");
      if (bVar8) {
        SaveIniSettingsToDisk((pIVar6->IO).IniFilename);
      }
      SameLine(0.0,-1.0);
      if ((pIVar6->IO).IniFilename == (char *)0x0) {
        TextUnformatted("<NULL>",(char *)0x0);
      }
      else {
        Text("\"%s\"");
      }
      Text("SettingsDirtyTimer %.2f",SUB84((double)pIVar6->SettingsDirtyTimer,0));
      bVar8 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                       (ulong)(uint)(pIVar6->SettingsHandlers).Size);
      if (bVar8) {
        for (iVar21 = 0; iVar21 < (pIVar6->SettingsHandlers).Size; iVar21 = iVar21 + 1) {
          pIVar15 = ImVector<ImGuiSettingsHandler>::operator[](&pIVar6->SettingsHandlers,iVar21);
          BulletText("%s",pIVar15->TypeName);
        }
        TreePop();
      }
      bVar8 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",
                       (ulong)(uint)(pIVar6->SettingsWindows).Buf.Size);
      if (bVar8) {
        settings = (ImGuiWindowSettings *)(pIVar6->SettingsWindows).Buf.Data;
        if (settings != (ImGuiWindowSettings *)0x0) {
          settings = (ImGuiWindowSettings *)&settings->Pos;
        }
        for (; settings != (ImGuiWindowSettings *)0x0;
            settings = ImChunkStream<ImGuiWindowSettings>::next_chunk
                                 (&pIVar6->SettingsWindows,settings)) {
          DebugNodeWindowSettings(settings);
        }
        TreePop();
      }
      bVar8 = TreeNode("SettingsTables","Settings packed data: Tables: %d bytes",
                       (ulong)(uint)(pIVar6->SettingsTables).Buf.Size);
      if (bVar8) {
        settings_00 = (ImGuiTableSettings *)(pIVar6->SettingsTables).Buf.Data;
        if (settings_00 != (ImGuiTableSettings *)0x0) {
          settings_00 = (ImGuiTableSettings *)&settings_00->SaveFlags;
        }
        for (; settings_00 != (ImGuiTableSettings *)0x0;
            settings_00 = ImChunkStream<ImGuiTableSettings>::next_chunk
                                    (&pIVar6->SettingsTables,settings_00)) {
          DebugNodeTableSettings(settings_00);
        }
        TreePop();
      }
      iVar21 = (pIVar6->SettingsIniData).Buf.Size;
      uVar26 = (ulong)(iVar21 - 1);
      if (iVar21 == 0) {
        uVar26 = 0;
      }
      bVar8 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",uVar26);
      if (bVar8) {
        pcVar18 = (pIVar6->SettingsIniData).Buf.Data;
        pcVar17 = ImGuiTextBuffer::EmptyString;
        if (pcVar18 != (char *)0x0) {
          pcVar17 = pcVar18;
        }
        buf_1._4_4_ = GImGui->FontSize * 20.0;
        buf_1[0] = '\0';
        buf_1[1] = '\0';
        buf_1[2] = -0x80;
        buf_1[3] = -0x80;
        InputTextMultiline("##Ini",pcVar17,(long)(pIVar6->SettingsIniData).Buf.Size,(ImVec2 *)buf_1,
                           0x4000,(ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      TreePop();
    }
    bVar8 = TreeNode("Internal state");
    if (bVar8) {
      pcVar17 = "NULL";
      Text("WINDOWING");
      Indent(0.0);
      pcVar18 = "NULL";
      if (pIVar6->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar18 = pIVar6->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",pcVar18);
      pcVar18 = "NULL";
      if (pIVar6->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar18 = pIVar6->HoveredWindow->RootWindow->Name;
      }
      Text("HoveredWindow->Root: \'%s\'",pcVar18);
      pcVar18 = "NULL";
      if (pIVar6->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0) {
        pcVar18 = pIVar6->HoveredWindowUnderMovingWindow->Name;
      }
      Text("HoveredWindowUnderMovingWindow: \'%s\'",pcVar18);
      pcVar18 = "NULL";
      if (pIVar6->MovingWindow != (ImGuiWindow *)0x0) {
        pcVar18 = pIVar6->MovingWindow->Name;
      }
      uVar26 = 0;
      Text("MovingWindow: \'%s\'",pcVar18);
      Unindent(0.0);
      Text("ITEMS");
      Indent(0.0);
      local_1d0 = (ImVector<ImGuiViewportP_*> *)(double)pIVar6->ActiveIdTimer;
      uVar20 = pIVar6->ActiveIdPreviousFrame;
      bVar8 = pIVar6->ActiveIdAllowOverlap;
      uVar28 = pIVar6->ActiveId;
      pcVar18 = GetInputSourceName(pIVar6->ActiveIdSource);
      Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",(int)local_1d0,
           (ulong)uVar28,(ulong)uVar20,(ulong)bVar8,pcVar18);
      if (pIVar6->ActiveIdWindow != (ImGuiWindow *)0x0) {
        pcVar17 = pIVar6->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",pcVar17);
      windows = (ImVector<ImGuiWindow_*> *)local_1a8._0_8_;
      for (iVar21 = 0x200; iVar21 != 0x285; iVar21 = iVar21 + 1) {
        bVar8 = ImBitArray<133,_-512>::operator[](&pIVar6->ActiveIdUsingKeyInputMask,iVar21);
        uVar26 = (ulong)((int)uVar26 + (uint)bVar8);
      }
      Text("ActiveIdUsing: Wheel: %d, NavDirMask: %X, NavInputMask: %X, KeyInputMask: %d key(s)",
           (ulong)pIVar6->ActiveIdUsingMouseWheel,(ulong)pIVar6->ActiveIdUsingNavDirMask,
           (ulong)pIVar6->ActiveIdUsingNavInputMask,uVar26);
      Text("HoveredId: 0x%08X (%.2f sec), AllowOverlap: %d",SUB84((double)pIVar6->HoveredIdTimer,0),
           (ulong)pIVar6->HoveredIdPreviousFrame,(ulong)pIVar6->HoveredIdAllowOverlap);
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)pIVar6->DragDropActive,(ulong)(pIVar6->DragDropPayload).SourceId,
           (pIVar6->DragDropPayload).DataType,(ulong)(uint)(pIVar6->DragDropPayload).DataSize);
      Unindent(0.0);
      Text("NAV,FOCUS");
      Indent(0.0);
      pcVar17 = "NULL";
      pcVar18 = "NULL";
      if (pIVar6->NavWindow != (ImGuiWindow *)0x0) {
        pcVar18 = pIVar6->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",pcVar18);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar6->NavId,(ulong)pIVar6->NavLayer);
      pcVar18 = GetInputSourceName(pIVar6->NavInputSource);
      Text("NavInputSource: %s",pcVar18);
      Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar6->IO).NavActive,
           (ulong)(pIVar6->IO).NavVisible);
      Text("NavActivateId/DownId/PressedId/InputId: %08X/%08X/%08X/%08X",
           (ulong)pIVar6->NavActivateId,(ulong)pIVar6->NavActivateDownId,
           (ulong)pIVar6->NavActivatePressedId);
      Text("NavActivateFlags: %04X",(ulong)(uint)pIVar6->NavActivateFlags);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar6->NavDisableHighlight,
           (ulong)pIVar6->NavDisableMouseHover);
      Text("NavFocusScopeId = 0x%08X",(ulong)pIVar6->NavFocusScopeId);
      if (pIVar6->NavWindowingTarget != (ImGuiWindow *)0x0) {
        pcVar17 = pIVar6->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",pcVar17);
      Unindent(0.0);
      TreePop();
    }
    if (((pIVar6->DebugMetricsConfig).ShowWindowsRects != false) ||
       ((pIVar6->DebugMetricsConfig).ShowWindowsBeginOrder == true)) {
      for (iVar21 = 0; iVar21 < windows->Size; iVar21 = iVar21 + 1) {
        ppIVar11 = ImVector<ImGuiWindow_*>::operator[](windows,iVar21);
        pIVar3 = *ppIVar11;
        if (pIVar3->WasActive == true) {
          pIVar10 = GetForegroundDrawList();
          if ((pIVar6->DebugMetricsConfig).ShowWindowsRects == true) {
            buf_1._0_16_ = (undefined1  [16])
                           ShowMetricsWindow::Funcs::GetWindowRect(pIVar3,*local_198);
            ImDrawList::AddRect(pIVar10,(ImVec2 *)buf_1,(ImVec2 *)(buf_1 + 8),0xff8000ff,0.0,0,1.0);
          }
          if (((pIVar6->DebugMetricsConfig).ShowWindowsBeginOrder == true) &&
             ((pIVar3->Flags & 0x1000000) == 0)) {
            ImFormatString(buf_1,0x20,"%d",(ulong)(uint)(int)pIVar3->BeginOrderWithinContext);
            local_1d8.y = GImGui->FontSize + (pIVar3->Pos).y;
            local_1d8.x = GImGui->FontSize + (pIVar3->Pos).x;
            ImDrawList::AddRectFilled(pIVar10,&pIVar3->Pos,&local_1d8,0xff6464c8,0.0,0);
            ImDrawList::AddText(pIVar10,&pIVar3->Pos,0xffffffff,buf_1,(char *)0x0);
          }
        }
      }
    }
    if ((pIVar6->DebugMetricsConfig).ShowTablesRects == true) {
      for (iVar21 = 0; iVar21 < (pIVar6->Tables).Map.Data.Size; iVar21 = iVar21 + 1) {
        pIVar9 = ImPool<ImGuiTable>::TryGetMapData((ImPool<ImGuiTable> *)local_1c8,iVar21);
        if ((pIVar9 != (ImGuiTable *)0x0) && (pIVar6->FrameCount + -1 <= pIVar9->LastFrameActive)) {
          pIVar10 = GetForegroundDrawList();
          if (*local_1b0 < 6) {
            buf_1._0_16_ = (undefined1  [16])
                           ShowMetricsWindow::Funcs::GetTableRect(pIVar9,*local_1b0,-1);
            ImDrawList::AddRect(pIVar10,(ImVec2 *)buf_1,(ImVec2 *)(buf_1 + 8),0xff8000ff,0.0,0,1.0);
          }
          else {
            for (iVar19 = 0; iVar19 < pIVar9->ColumnsCount; iVar19 = iVar19 + 1) {
              buf_1._0_16_ = (undefined1  [16])
                             ShowMetricsWindow::Funcs::GetTableRect(pIVar9,*local_1b0,iVar19);
              bVar8 = iVar19 == pIVar9->HoveredColumnBody;
              col = 0xff8000ff;
              if (bVar8) {
                col = 0xff80ffff;
              }
              ImDrawList::AddRect(pIVar10,(ImVec2 *)buf_1,(ImVec2 *)(buf_1 + 8),col,0.0,0,
                                  *(float *)(&DAT_00197780 + (ulong)bVar8 * 4));
            }
          }
        }
      }
    }
    End();
    return;
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    if (cfg->ShowDebugLog)
        ShowDebugLogWindow(&cfg->ShowDebugLog);
    if (cfg->ShowStackTool)
        ShowStackToolWindow(&cfg->ShowStackTool);

    if (!Begin("Dear ImGui Metrics/Debugger", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    // Basic info
    Text("Dear ImGui %s", GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d visible windows, %d active allocations", io.MetricsRenderWindows, io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentIdeal, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentIdeal", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_InnerRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsWorkRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentFrozen, TRT_ColumnsContentUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "InnerRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsWorkRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentFrozen", "ColumnsContentUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent); // Always using last submitted instance
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table_instance->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table_instance->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table_instance->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table_instance->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table_instance->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }

        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        bool show_encoding_viewer = TreeNode("UTF-8 Encoding viewer");
        SameLine();
        MetricsHelpMarker("You can also call ImGui::DebugTextEncoding() from your code with a given string to test that your UTF-8 encoding settings are correct.");
        if (show_encoding_viewer)
        {
            static char buf[100] = "";
            SetNextItemWidth(-FLT_MIN);
            InputText("##Text", buf, IM_ARRAYSIZE(buf));
            if (buf[0] != 0)
                DebugTextEncoding(buf);
            TreePop();
        }

        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Checkbox("Show Item Picker", &g.DebugItemPickerActive) && g.DebugItemPickerActive)
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        // Stack Tool is your best friend!
        Checkbox("Show Debug Log", &cfg->ShowDebugLog);
        SameLine();
        MetricsHelpMarker("You can also call ImGui::ShowDebugLogWindow() from your code.");

        // Stack Tool is your best friend!
        Checkbox("Show Stack Tool", &cfg->ShowStackTool);
        SameLine();
        MetricsHelpMarker("You can also call ImGui::ShowStackToolWindow() from your code.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }

        Checkbox("Show tables rectangles", &cfg->ShowTablesRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowTablesRects |= Combo("##show_table_rects_type", &cfg->ShowTablesRectsType, trt_rects_names, TRT_Count, TRT_Count);
        if (cfg->ShowTablesRects && g.NavWindow != NULL)
        {
            for (int table_n = 0; table_n < g.Tables.GetMapSize(); table_n++)
            {
                ImGuiTable* table = g.Tables.TryGetMapData(table_n);
                if (table == NULL || table->LastFrameActive < g.FrameCount - 1 || (table->OuterWindow != g.NavWindow && table->InnerWindow != g.NavWindow))
                    continue;

                BulletText("Table 0x%08X (%d columns, in '%s')", table->ID, table->ColumnsCount, table->OuterWindow->Name);
                if (IsItemHovered())
                    GetForegroundDrawList()->AddRect(table->OuterRect.Min - ImVec2(1, 1), table->OuterRect.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                Indent();
                char buf[128];
                for (int rect_n = 0; rect_n < TRT_Count; rect_n++)
                {
                    if (rect_n >= TRT_ColumnsRect)
                    {
                        if (rect_n != TRT_ColumnsRect && rect_n != TRT_ColumnsClipRect)
                            continue;
                        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                        {
                            ImRect r = Funcs::GetTableRect(table, rect_n, column_n);
                            ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), column_n, trt_rects_names[rect_n]);
                            Selectable(buf);
                            if (IsItemHovered())
                                GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                        }
                    }
                    else
                    {
                        ImRect r = Funcs::GetTableRect(table, rect_n, -1);
                        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), trt_rects_names[rect_n]);
                        Selectable(buf);
                        if (IsItemHovered())
                            GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                    }
                }
                Unindent();
            }
        }

        TreePop();
    }

    // Windows
    if (TreeNode("Windows", "Windows (%d)", g.Windows.Size))
    {
        //SetNextItemOpen(true, ImGuiCond_Once);
        DebugNodeWindowsList(&g.Windows, "By display order");
        DebugNodeWindowsList(&g.WindowsFocusOrder, "By focus order (root windows)");
        if (TreeNode("By submission order (begin stack)"))
        {
            // Here we display windows in their submitted order/hierarchy, however note that the Begin stack doesn't constitute a Parent<>Child relationship!
            ImVector<ImGuiWindow*>& temp_buffer = g.WindowsTempSortBuffer;
            temp_buffer.resize(0);
            for (int i = 0; i < g.Windows.Size; i++)
                if (g.Windows[i]->LastFrameActive + 1 >= g.FrameCount)
                    temp_buffer.push_back(g.Windows[i]);
            struct Func { static int IMGUI_CDECL WindowComparerByBeginOrder(const void* lhs, const void* rhs) { return ((int)(*(const ImGuiWindow* const *)lhs)->BeginOrderWithinContext - (*(const ImGuiWindow* const*)rhs)->BeginOrderWithinContext); } };
            ImQsort(temp_buffer.Data, (size_t)temp_buffer.Size, sizeof(ImGuiWindow*), Func::WindowComparerByBeginOrder);
            DebugNodeWindowsListByBeginStackParent(temp_buffer.Data, temp_buffer.Size, NULL);
            TreePop();
        }

        TreePop();
    }

    // DrawLists
    int drawlist_count = 0;
    for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        drawlist_count += g.Viewports[viewport_i]->DrawDataBuilder.GetDrawListCount();
    if (TreeNode("DrawLists", "DrawLists (%d)", drawlist_count))
    {
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);
        for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        {
            ImGuiViewportP* viewport = g.Viewports[viewport_i];
            for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                    DebugNodeDrawList(NULL, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        }
        TreePop();
    }

    // Viewports
    if (TreeNode("Viewports", "Viewports (%d)", g.Viewports.Size))
    {
        Indent(GetTreeNodeToLabelSpacing());
        RenderViewportsThumbnails();
        Unindent(GetTreeNodeToLabelSpacing());
        for (int i = 0; i < g.Viewports.Size; i++)
            DebugNodeViewport(g.Viewports[i]);
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetAliveCount()))
    {
        for (int n = 0; n < g.TabBars.GetMapSize(); n++)
            if (ImGuiTabBar* tab_bar = g.TabBars.TryGetMapData(n))
            {
                PushID(tab_bar);
                DebugNodeTabBar(tab_bar, "TabBar");
                PopID();
            }
        TreePop();
    }

    // Details for Tables
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetAliveCount()))
    {
        for (int n = 0; n < g.Tables.GetMapSize(); n++)
            if (ImGuiTable* table = g.Tables.TryGetMapData(n))
                DebugNodeTable(table);
        TreePop();
    }

    // Details for Fonts
    ImFontAtlas* atlas = g.IO.Fonts;
    if (TreeNode("Fonts", "Fonts (%d)", atlas->Fonts.Size))
    {
        ShowFontAtlas(atlas);
        TreePop();
    }

    // Details for InputText
    if (TreeNode("InputText"))
    {
        DebugNodeInputTextState(&g.InputTextState);
        TreePop();
    }

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredWindow->Root: '%s'", g.HoveredWindow ? g.HoveredWindow->RootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, GetInputSourceName(g.ActiveIdSource));
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");

        int active_id_using_key_input_count = 0;
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            active_id_using_key_input_count += g.ActiveIdUsingKeyInputMask[n] ? 1 : 0;
        Text("ActiveIdUsing: Wheel: %d, NavDirMask: %X, NavInputMask: %X, KeyInputMask: %d key(s)", g.ActiveIdUsingMouseWheel, g.ActiveIdUsingNavDirMask, g.ActiveIdUsingNavInputMask, active_id_using_key_input_count);
        Text("HoveredId: 0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Not displaying g.HoveredId as it is update mid-frame
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", GetInputSourceName(g.NavInputSource));
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId/DownId/PressedId/InputId: %08X/%08X/%08X/%08X", g.NavActivateId, g.NavActivateDownId, g.NavActivatePressedId, g.NavActivateInputId);
        Text("NavActivateFlags: %04X", g.NavActivateFlags);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

    // Overlay: Display Tables Rectangles
    if (cfg->ShowTablesRects)
    {
        for (int table_n = 0; table_n < g.Tables.GetMapSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.TryGetMapData(table_n);
            if (table == NULL || table->LastFrameActive < g.FrameCount - 1)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(table->OuterWindow);
            if (cfg->ShowTablesRectsType >= TRT_ColumnsRect)
            {
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                {
                    ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, column_n);
                    ImU32 col = (table->HoveredColumnBody == column_n) ? IM_COL32(255, 255, 128, 255) : IM_COL32(255, 0, 128, 255);
                    float thickness = (table->HoveredColumnBody == column_n) ? 3.0f : 1.0f;
                    draw_list->AddRect(r.Min, r.Max, col, 0.0f, 0, thickness);
                }
            }
            else
            {
                ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, -1);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
        }
    }

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}